

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogButtons(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImVec2 local_28;
  
  pIVar2 = GImGui;
  PushID("LogButtons");
  local_28.x = 0.0;
  local_28.y = 0.0;
  bVar4 = Button("Log To TTY",&local_28);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    (pIVar1->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
    (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  local_28.x = 0.0;
  local_28.y = 0.0;
  bVar5 = Button("Log To File",&local_28);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    (pIVar1->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
    (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  local_28.x = 0.0;
  local_28.y = 0.0;
  bVar6 = Button("Log To Clipboard",&local_28);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    (pIVar1->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
    (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  PushItemFlag(1,true);
  pIVar3 = GImGui;
  (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
  (pIVar3->NextItemData).Width = 80.0;
  SliderInt("Default Depth",&pIVar2->LogDepthToExpandDefault,0,9,(char *)0x0);
  PopItemFlag();
  PopID();
  pIVar2 = GImGui;
  if ((bVar4) && (GImGui->LogEnabled == false)) {
    LogBegin(ImGuiLogType_TTY,-1);
    pIVar2->LogFile = _stdout;
  }
  if (bVar5) {
    LogToFile(-1,(char *)0x0);
  }
  if ((bVar6) && (GImGui->LogEnabled == false)) {
    LogBegin(ImGuiLogType_Clipboard,-1);
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
    const bool log_to_tty = Button("Log To TTY"); SameLine();
#else
    const bool log_to_tty = false;
#endif
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushAllowKeyboardFocus(false);
    SetNextItemWidth(80.0f);
    SliderInt("Default Depth", &g.LogDepthToExpandDefault, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY();
    if (log_to_file)
        LogToFile();
    if (log_to_clipboard)
        LogToClipboard();
}